

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_id_func.h
# Opt level: O0

void __thiscall
ArrayIDFunc<std::vector<int,_std::allocator<int>_>_>::~ArrayIDFunc
          (ArrayIDFunc<std::vector<int,_std::allocator<int>_>_> *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  long in_RDI;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *this_00;
  
  this_00 = *(vector<int,_std::allocator<int>_> **)(in_RDI + 8);
  if (this_00 != (vector<int,_std::allocator<int>_> *)0x0) {
    pvVar1 = this_00 + -1;
    local_18 = this_00 + (long)this_00[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
    if (this_00 != local_18) {
      do {
        local_18 = local_18 + -1;
        std::vector<int,_std::allocator<int>_>::~vector(this_00);
      } while (local_18 != this_00);
    }
    operator_delete__(&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

~ArrayIDFunc() { delete[] data_; }